

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::FileReadStream,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,FileReadStream *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  FileReadStream *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  double d_00;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int p;
  char *decimal;
  size_t length;
  bool cont;
  int maxExp_1;
  int maxExp;
  bool expMinus;
  int exp;
  size_t decimalPosition;
  int expFrac;
  bool useDouble;
  int significandDigit;
  bool use64bit;
  uint64_t i64;
  uint i;
  bool minus;
  bool useNanOrInf;
  double d;
  size_t startOffset;
  NumberStream<rapidjson::FileReadStream,_false,_false> s;
  StreamLocalCopy<rapidjson::FileReadStream,_0> copy;
  NumberStream<rapidjson::FileReadStream,_false,_false> *in_stack_fffffffffffffed8;
  uint i_00;
  ParseErrorCode PVar10;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffee0;
  bool local_71;
  bool local_65;
  int local_64;
  int local_58;
  int local_50;
  ulong local_48;
  uint local_40;
  double local_38;
  NumberStream<rapidjson::FileReadStream,_false,_false> local_28;
  StreamLocalCopy<rapidjson::FileReadStream,_0> local_20;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_18;
  
  local_18 = in_RDX;
  internal::StreamLocalCopy<rapidjson::FileReadStream,_0>::StreamLocalCopy(&local_20,in_RSI);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::FileReadStream,_false,_false>::NumberStream(&local_28,in_RDI,local_20.s);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::FileReadStream,_false,_false>::Tell
            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0e6e);
  local_38 = 0.0;
  bVar1 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                    (in_stack_fffffffffffffed8,'\0');
  local_40 = 0;
  local_48 = 0;
  bVar5 = false;
  local_50 = 0;
  CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                    ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0edc);
  if (CVar2 == '0') {
    local_40 = 0;
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0f07);
  }
  else {
    CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                      ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0f19);
    bVar3 = false;
    if ('0' < CVar2) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0f37);
      bVar3 = CVar2 < ':';
    }
    if (bVar3) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0f68);
      local_40 = (int)CVar2 - 0x30;
      if (!bVar1) {
        do {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b10a9);
          bVar3 = false;
          if ('/' < CVar2) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b10c7);
            bVar3 = CVar2 < ':';
          }
          if (!bVar3) goto LAB_004b1235;
          if (0x19999998 < local_40) {
            bVar3 = true;
            if (local_40 == 0x19999999) {
              CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                                ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1126);
              bVar3 = '5' < CVar2;
            }
            if (bVar3) goto LAB_004b1147;
          }
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b117e);
          local_40 = local_40 * 10 + CVar2 + -0x30;
          local_50 = local_50 + 1;
        } while( true );
      }
      do {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0f92);
        bVar3 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b0fb0);
          bVar3 = CVar2 < ':';
        }
        if (!bVar3) goto LAB_004b1235;
        if (0xccccccb < local_40) {
          bVar3 = true;
          if (local_40 == 0xccccccc) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b100f);
            bVar3 = '8' < CVar2;
          }
          if (bVar3) goto LAB_004b1030;
        }
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1067);
        local_40 = local_40 * 10 + CVar2 + -0x30;
        local_50 = local_50 + 1;
      } while( true );
    }
    bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x4b11c4);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                    ,0x5fd,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::FileReadStream,_false,_false>::Tell
              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b11fa);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_stack_fffffffffffffee0,
                  (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20),0x4b120f);
    bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x4b121e);
    if (bVar3) {
      return;
    }
  }
LAB_004b1235:
  bVar3 = false;
  if (bVar5) {
    if (!bVar1) {
      do {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b13a4);
        bVar4 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b13bf);
          bVar4 = CVar2 < ':';
        }
        if (!bVar4) goto LAB_004b14d0;
        if (0x1999999999999998 < local_48) {
          bVar4 = true;
          if (local_48 == 0x1999999999999999) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1426);
            bVar4 = '5' < CVar2;
          }
          if (bVar4) goto LAB_004b1441;
        }
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b149c);
        local_48 = local_48 * 10 + (ulong)((int)CVar2 - 0x30);
        local_50 = local_50 + 1;
      } while( true );
    }
    do {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1268);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1283);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (0xccccccccccccccb < local_48) {
        bVar4 = true;
        if (local_48 == 0xccccccccccccccc) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b12ea);
          bVar4 = '8' < CVar2;
        }
        if (bVar4) goto LAB_004b1305;
      }
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1360);
      local_48 = local_48 * 10 + (ulong)((int)CVar2 - 0x30);
      local_50 = local_50 + 1;
    } while( true );
  }
LAB_004b14d0:
  if (bVar3) {
    while( true ) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b14ed);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1508);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b153f);
      local_38 = local_38 * 10.0 + (double)(CVar2 + -0x30);
    }
  }
  local_58 = 0;
  bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                    (in_stack_fffffffffffffed8,'\0');
  if (bVar4) {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::FileReadStream,_false,_false>::Length(&local_28);
    CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                      ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b15b7);
    bVar4 = false;
    if ('/' < CVar2) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b15d2);
      bVar4 = CVar2 < ':';
    }
    if (!bVar4) {
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x4b1603);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x628,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      NumberStream<rapidjson::FileReadStream,_false,_false>::Tell
                ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1639);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)in_stack_fffffffffffffee0,
                    (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20),0x4b164e);
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x4b165d);
      if (bVar4) {
        return;
      }
    }
    if (!bVar3) {
      if (!bVar5) {
        local_48 = (ulong)local_40;
      }
      while( true ) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b16a8);
        bVar3 = false;
        if ('/' < CVar2) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b16c3);
          bVar3 = CVar2 < ':';
        }
        if ((!bVar3) || (0x1fffffffffffff < local_48)) break;
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b170f);
        local_48 = local_48 * 10 + (ulong)((int)CVar2 - 0x30);
        local_58 = local_58 + -1;
        if (local_48 != 0) {
          local_50 = local_50 + 1;
        }
      }
      auVar9._8_4_ = (int)(local_48 >> 0x20);
      auVar9._0_8_ = local_48;
      auVar9._12_4_ = 0x45300000;
      local_38 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0);
      bVar3 = true;
    }
    while( true ) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b17a8);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b17c3);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (local_50 < 0x11) {
        CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                          ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b180b);
        local_38 = local_38 * 10.0 + (double)(CVar2 + -0x30);
        local_58 = local_58 + -1;
        if (0.0 < local_38) {
          local_50 = local_50 + 1;
        }
      }
      else {
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        NumberStream<rapidjson::FileReadStream,_false,_false>::TakePush
                  ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1882);
      }
    }
  }
  else {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::FileReadStream,_false,_false>::Length(&local_28);
  }
  bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                    (in_stack_fffffffffffffed8,'\0');
  if ((bVar4) ||
     (bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                        (in_stack_fffffffffffffed8,'\0'), bVar4)) {
    if (!bVar3) {
      bVar3 = true;
    }
    local_65 = false;
    bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                      (in_stack_fffffffffffffed8,'\0');
    if (!bVar4) {
      local_65 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                           (in_stack_fffffffffffffed8,'\0');
    }
    CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                      ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1997);
    bVar4 = false;
    if ('/' < CVar2) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b19b2);
      bVar4 = CVar2 < ':';
    }
    if (bVar4) {
      CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Take
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b19dd);
      local_64 = CVar2 + -0x30;
      if (local_65 == false) {
        while( true ) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1b4d);
          bVar4 = false;
          if ('/' < CVar2) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1b68);
            bVar4 = CVar2 < ':';
          }
          if (!bVar4) break;
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Take
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1b9f);
          local_64 = local_64 * 10 + CVar2 + -0x30;
          if (0x134 - local_58 < local_64) {
            bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)0x4b1be0);
            if (((bVar4 ^ 0xffU) & 1) == 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                            ,0x678,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)in_stack_fffffffffffffee0,
                          (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20),0x4b1c23);
            bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)0x4b1c32);
            if (bVar4) {
              return;
            }
          }
        }
      }
      else {
        if (0 < local_58) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                        ,0x668,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        while( true ) {
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1a4b);
          bVar4 = false;
          if ('/' < CVar2) {
            CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                              ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1a66);
            bVar4 = CVar2 < ':';
          }
          if (!bVar4) break;
          CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::FileReadStream,_false,_false>::Take
                            ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1a9d);
          local_64 = local_64 * 10 + CVar2 + -0x30;
          if ((local_58 + 0x7ffffff7) / 10 < local_64) {
            while( true ) {
              CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                                ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1adc);
              bVar4 = false;
              if ('/' < CVar2) {
                CVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                        ::NumberStream<rapidjson::FileReadStream,_false,_false>::Peek
                                  ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1af7
                                  );
                bVar4 = CVar2 < ':';
              }
              if (!bVar4) break;
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::FileReadStream,_false,_false>::Take
                        ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1b1f);
            }
          }
        }
      }
    }
    else {
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x4b1c64);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      NumberStream<rapidjson::FileReadStream,_false,_false>::Tell
                ((NumberStream<rapidjson::FileReadStream,_false,_false> *)0x4b1c9a);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)in_stack_fffffffffffffee0,
                    (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20),0x4b1caf);
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x4b1cbe);
      if (bVar4) {
        return;
      }
    }
  }
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::FileReadStream,_false,_false>::Length(&local_28);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::FileReadStream,_false,_false>::Pop(&local_28);
  i_00 = (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (bVar3) {
    d_00 = internal::StrtodNormalPrecision((double)in_stack_fffffffffffffee0,i_00);
    PVar10 = (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    dVar6 = std::numeric_limits<double>::max();
    if (dVar6 < d_00) {
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x4b1d96);
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x6ac,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)in_stack_fffffffffffffee0,PVar10,0x4b1dd9);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x4b1de8);
      if (bVar5) {
        return;
      }
    }
    if (bVar1) {
      d_00 = -d_00;
    }
    local_71 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Double(local_18,d_00);
    PVar10 = (ParseErrorCode)((ulong)d_00 >> 0x20);
    in_stack_fffffffffffffee0 = local_18;
  }
  else if (bVar5) {
    if (bVar1) {
      local_71 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int64(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
      PVar10 = (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    }
    else {
      local_71 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Uint64(in_stack_fffffffffffffee0,(uint64_t)in_stack_fffffffffffffed8);
      PVar10 = (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    }
  }
  else if (bVar1) {
    local_71 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Int(in_stack_fffffffffffffee0,i_00);
    PVar10 = (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  }
  else {
    local_71 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Uint(in_stack_fffffffffffffee0,i_00);
    PVar10 = (ParseErrorCode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  }
  if (((local_71 ^ 0xffU) & 1) != 0) {
    bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x4b1f66);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                    ,0x6c4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_stack_fffffffffffffee0,PVar10,0x4b1fa9);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x4b1fb8);
  }
  return;
LAB_004b1147:
  local_48 = (ulong)local_40;
  bVar5 = true;
  goto LAB_004b1235;
LAB_004b1030:
  local_48 = (ulong)local_40;
  bVar5 = true;
  goto LAB_004b1235;
LAB_004b1441:
  auVar8._8_4_ = (int)(local_48 >> 0x20);
  auVar8._0_8_ = local_48;
  auVar8._12_4_ = 0x45300000;
  local_38 = (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0);
  bVar3 = true;
  goto LAB_004b14d0;
LAB_004b1305:
  auVar7._8_4_ = (int)(local_48 >> 0x20);
  auVar7._0_8_ = local_48;
  auVar7._12_4_ = 0x45300000;
  local_38 = (auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0);
  bVar3 = true;
  goto LAB_004b14d0;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }